

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O3

void * thread_socket(void *p)

{
  int iVar1;
  
  skynet_initthread(2);
  iVar1 = skynet_socket_poll();
  if (iVar1 != 0) {
    do {
      if (iVar1 < 0) {
        iVar1 = skynet_context_total();
        if (iVar1 == 0) {
          return (void *)0x0;
        }
      }
      else if (*p <= *(int *)((long)p + 0x68)) {
        pthread_cond_signal((pthread_cond_t *)((long)p + 0x10));
      }
      iVar1 = skynet_socket_poll();
    } while (iVar1 != 0);
  }
  return (void *)0x0;
}

Assistant:

static void *
thread_socket(void *p) {
	struct monitor * m = p;
	skynet_initthread(THREAD_SOCKET);
	for (;;) {
		int r = skynet_socket_poll();
		if (r==0)
			break;
		if (r<0) {
			CHECK_ABORT
			continue;
		}
		wakeup(m,0);
	}
	return NULL;
}